

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool cmGetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name_00;
  pointer pbVar1;
  cmExecutionStatus *status_00;
  OutType OVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool source_file_target_option_enabled;
  bool bVar6;
  PolicyStatus PVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  cmState *pcVar8;
  cmPropertyDefinition *pcVar9;
  cmTarget *this_00;
  cmTest *this_01;
  cmake *pcVar10;
  cmInstalledFile *this_02;
  string *psVar11;
  cmGlobalGenerator *pcVar12;
  cmMakefile *pcVar13;
  pointer value;
  cmSourceFile *this_03;
  cmValue cVar14;
  char *pcVar15;
  _Alloc_hider value_00;
  uint uVar16;
  PolicyID id;
  undefined8 extraout_RDX;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ScopeType SVar21;
  cmMakefile *pcVar22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string output;
  OutType local_13c;
  allocator<char> local_129;
  string name;
  string propertyName;
  string local_e0;
  cmExecutionStatus *local_c0;
  uint local_b4;
  ScopeType local_b0;
  uint local_ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  cmMakefile *test_directory_makefile;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  string test_directory;
  
  name_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name_00) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"called with incorrect number of arguments",
               (allocator<char> *)&local_e0);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&output);
    return false;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
  propertyName._M_string_length = 0;
  propertyName.field_2._M_local_buf[0] = '\0';
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_directory._M_dataplus._M_p = (pointer)&test_directory.field_2;
  test_directory._M_string_length = 0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c = OutValue;
  test_directory.field_2._M_local_buf[0] = '\0';
  bVar4 = std::operator==(name_00 + 1,"GLOBAL");
  SVar21 = GLOBAL;
  iVar19 = 1;
  uVar16 = 0;
  uVar20 = 0;
  if (!bVar4) {
    SVar21 = DIRECTORY;
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"DIRECTORY");
    if (bVar4) {
      uVar16 = 0;
      uVar20 = 0;
      goto LAB_0029477e;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"TARGET");
    SVar21 = TARGET;
    if (bVar4) {
LAB_002946f1:
      uVar16 = 0;
      uVar20 = 0;
      goto LAB_0029477e;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"SOURCE");
    if (bVar4) {
      uVar16 = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      uVar20 = 0;
      SVar21 = SOURCE_FILE;
      goto LAB_0029477e;
    }
    pcVar15 = "TEST";
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"TEST");
    if (bVar4) {
      uVar20 = (uint)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
      SVar21 = TEST;
LAB_0029477a:
      uVar16 = 0;
      goto LAB_0029477e;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"VARIABLE");
    if (bVar4) {
      uVar20 = 0;
      SVar21 = VARIABLE;
      goto LAB_0029477a;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"CACHE");
    if (bVar4) {
      uVar20 = 0;
      SVar21 = CACHE;
      goto LAB_0029477a;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"INSTALL");
    if (bVar4) {
      SVar21 = INSTALL;
      goto LAB_002946f1;
    }
    cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[87]>
              (&output,(char (*) [21])"given invalid scope ",
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,
               (char (*) [87])
               ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
              );
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00294ac0:
    std::__cxx11::string::~string((string *)&output);
    bVar6 = false;
    goto LAB_0029520e;
  }
LAB_0029477e:
  local_ac = uVar16 ^ 1;
  local_b4 = uVar20 ^ 1;
  uVar17 = 2;
  bVar6 = false;
  source_file_target_option_enabled = false;
  bVar4 = false;
  local_c0 = status;
  local_b0 = SVar21;
  while( true ) {
    status_00 = local_c0;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar17)
    break;
    bVar5 = std::operator==(pbVar1 + uVar17,"PROPERTY");
    OVar2 = local_13c;
    iVar3 = 2;
    if (bVar5) goto LAB_00294875;
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar17,"BRIEF_DOCS");
    iVar18 = 0;
    OVar2 = OutBriefDoc;
    iVar3 = 0;
    if (bVar5) goto LAB_00294875;
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar17,"FULL_DOCS");
    iVar3 = iVar18;
    if (bVar5) {
      OVar2 = OutFullDoc;
      goto LAB_00294875;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar17,"SET");
    if (bVar5) {
      OVar2 = OutSet;
      goto LAB_00294875;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar17,"DEFINED");
    if (bVar5) {
      OVar2 = OutDefined;
      goto LAB_00294875;
    }
    psVar11 = &name;
    if (iVar19 == 1) goto switchD_00294948_caseD_6;
    if (iVar19 == 0 && (char)local_ac == '\0') {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar17,"DIRECTORY");
      if (bVar5) {
        bVar4 = true;
        OVar2 = local_13c;
        iVar3 = 4;
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                "TARGET_DIRECTORY");
        if (!bVar5) goto LAB_002948e2;
        source_file_target_option_enabled = true;
        OVar2 = local_13c;
        iVar3 = 5;
      }
      goto LAB_00294875;
    }
LAB_002948e2:
    if (iVar19 == 0 && (char)local_b4 == '\0') {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar17,"DIRECTORY");
      bVar6 = true;
      OVar2 = local_13c;
      iVar3 = 6;
      if (!bVar5) goto switchD_00294948_caseD_3;
      goto LAB_00294875;
    }
    if (4 < iVar19 - 2U) {
switchD_00294948_caseD_3:
      cmStrCat<char_const(&)[25],std::__cxx11::string_const&,char_const(&)[3]>
                (&output,(char (*) [25])"given invalid argument \"",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar17,(char (*) [3])0x6e2148);
      std::__cxx11::string::_M_assign((string *)&local_c0->Error);
      goto LAB_00294ac0;
    }
    this = &source_file_directories;
    psVar11 = &test_directory;
    switch(iVar19) {
    case 2:
      psVar11 = &propertyName;
    case 6:
switchD_00294948_caseD_6:
      std::__cxx11::string::_M_assign((string *)psVar11);
      OVar2 = local_13c;
      break;
    case 3:
      goto switchD_00294948_caseD_3;
    case 5:
      this = &source_file_target_directories;
    case 4:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar17);
      OVar2 = local_13c;
    }
LAB_00294875:
    iVar19 = iVar3;
    local_13c = OVar2;
    uVar17 = (ulong)((int)uVar17 + 1);
  }
  if (propertyName._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"not given a PROPERTY <name> argument.",
               (allocator<char> *)&local_e0);
    std::__cxx11::string::_M_assign((string *)&local_c0->Error);
    goto LAB_00294ac0;
  }
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                    (local_c0,bVar4,source_file_target_option_enabled,&source_file_directories,
                     &source_file_target_directories,&source_file_directory_makefiles);
  bVar6 = SetPropertyCommand::HandleAndValidateTestDirectoryScopes
                    (status_00,bVar6,&test_directory,&test_directory_makefile);
  SVar21 = local_b0;
  if (!bVar5 || !bVar6) goto LAB_002951fe;
  if (local_13c == OutDefined) {
    pcVar8 = cmMakefile::GetState(status_00->Makefile);
    pcVar9 = cmState::GetPropertyDefinition(pcVar8,&propertyName,SVar21);
    pcVar15 = "1";
    if (pcVar9 == (cmPropertyDefinition *)0x0) {
      pcVar15 = "0";
    }
    bVar6 = true;
    value_03._M_str = pcVar15;
    value_03._M_len = 1;
    cmMakefile::AddDefinition(status_00->Makefile,name_00,value_03);
    goto switchD_00294bb2_caseD_7;
  }
  if (local_13c == OutFullDoc) {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_allocated_capacity =
         (ulong)(uint7)output.field_2._M_allocated_capacity._1_7_ << 8;
    pcVar8 = cmMakefile::GetState(status_00->Makefile);
    pcVar9 = cmState::GetPropertyDefinition(pcVar8,&propertyName,SVar21);
    if (pcVar9 != (cmPropertyDefinition *)0x0) {
      std::__cxx11::string::_M_assign((string *)&output);
    }
    if (output._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&output);
    }
    value_02._M_str = output._M_dataplus._M_p;
    value_02._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status_00->Makefile,name_00,value_02);
LAB_00294b40:
    std::__cxx11::string::~string((string *)&output);
    bVar6 = true;
    goto switchD_00294bb2_caseD_7;
  }
  if (local_13c == OutBriefDoc) {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_allocated_capacity =
         (ulong)(uint7)output.field_2._M_allocated_capacity._1_7_ << 8;
    pcVar8 = cmMakefile::GetState(status_00->Makefile);
    pcVar9 = cmState::GetPropertyDefinition(pcVar8,&propertyName,SVar21);
    if (pcVar9 != (cmPropertyDefinition *)0x0) {
      std::__cxx11::string::_M_assign((string *)&output);
    }
    if (output._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&output);
    }
    value_01._M_str = output._M_dataplus._M_p;
    value_01._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status_00->Makefile,name_00,value_01);
    goto LAB_00294b40;
  }
  bVar6 = true;
  switch(local_b0) {
  case TARGET:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for TARGET scope.",(allocator<char> *)&local_e0);
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
    }
    else {
      this_00 = cmMakefile::FindTargetToUse(status_00->Makefile,&name,false);
      if (this_00 != (cmTarget *)0x0) {
        bVar4 = std::operator==(&propertyName,"ALIASED_TARGET");
        if ((!bVar4) && (bVar4 = std::operator==(&propertyName,"ALIAS_GLOBAL"), !bVar4)) {
          cVar14 = cmTarget::GetComputedProperty(this_00,&propertyName,status_00->Makefile);
          if (cVar14.Value == (string *)0x0) {
            cVar14 = cmTarget::GetProperty(this_00,&propertyName);
          }
          goto LAB_002952c9;
        }
        bVar4 = cmMakefile::IsAlias(status_00->Makefile,&name);
        if (bVar4) {
          bVar4 = std::operator==(&propertyName,"ALIASED_TARGET");
          if (bVar4) {
            pcVar22 = status_00->Makefile;
            psVar11 = cmTarget::GetName_abi_cxx11_(this_00);
            value = (psVar11->_M_dataplus)._M_p;
            goto LAB_00294e8d;
          }
          bVar4 = std::operator==(&propertyName,"ALIAS_GLOBAL");
          if (bVar4) {
            pcVar22 = status_00->Makefile;
            pcVar12 = cmMakefile::GetGlobalGenerator(pcVar22);
            bVar4 = cmGlobalGenerator::IsAlias(pcVar12,&name);
            pcVar15 = "FALSE";
            if (bVar4) {
              pcVar15 = "TRUE";
            }
            (anonymous_namespace)::StoreResult<char_const*>(local_13c,pcVar22,name_00,pcVar15);
            goto switchD_00294bb2_caseD_7;
          }
        }
        pcVar22 = status_00->Makefile;
        cVar14.Value = (string *)0x0;
        goto LAB_0029532d;
      }
      cmStrCat<char_const(&)[23],std::__cxx11::string_const&,char_const(&)[40]>
                (&output,(char (*) [23])"could not find TARGET ",&name,
                 (char (*) [40])".  Perhaps it has not yet been created.");
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
    }
    break;
  case SOURCE_FILE:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for SOURCE scope.",(allocator<char> *)&local_e0);
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
      break;
    }
    pcVar22 = *source_file_directory_makefiles.
               super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    __x._M_str = propertyName._M_dataplus._M_p;
    __x._M_len = propertyName._M_string_length;
    __y._M_str = "GENERATED";
    __y._M_len = 9;
    bVar6 = std::operator==(__x,__y);
    if (bVar6) {
      pcVar13 = status_00->Makefile;
      PVar7 = cmMakefile::GetPolicyStatus(pcVar22,CMP0163,false);
      if (WARN < PVar7) {
        output.field_2._M_allocated_capacity = 0;
        output.field_2._8_8_ = 0;
        output._M_dataplus._M_p = (pointer)0x0;
        output._M_string_length = 0;
        output._M_dataplus._M_p = (pointer)operator_new(0x18);
        *(OutType *)output._M_dataplus._M_p = local_13c;
        *(string **)((long)output._M_dataplus._M_p + 8) = name_00;
        *(cmMakefile **)((long)output._M_dataplus._M_p + 0x10) = pcVar13;
        output.field_2._8_8_ =
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetPropertyCommand.cxx:453:19)>
             ::_M_invoke;
        output.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetPropertyCommand.cxx:453:19)>
             ::_M_manager;
        bVar6 = GetPropertyCommand::GetSourceFilePropertyGENERATED
                          (&name,pcVar13,(function<bool_(bool)> *)&output);
        std::_Function_base::~_Function_base((_Function_base *)&output);
        goto switchD_00294bb2_caseD_7;
      }
    }
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              (&output,status_00,&name,(bool)(source_file_target_option_enabled | bVar4));
    this_03 = cmMakefile::GetOrCreateSource(pcVar22,&output,false,Ambiguous);
    bVar6 = this_03 != (cmSourceFile *)0x0;
    if (this_03 == (cmSourceFile *)0x0) {
      cmStrCat<char_const(&)[55],std::__cxx11::string_const&>
                (&local_e0,(char (*) [55])"given SOURCE name that could not be found or created: ",
                 &output);
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      pcVar22 = status_00->Makefile;
      cVar14 = cmSourceFile::GetPropertyForUser(this_03,&propertyName);
      anon_unknown.dwarf_89a4a5::StoreResult<cmValue>(local_13c,pcVar22,name_00,cVar14);
    }
LAB_002952a3:
    std::__cxx11::string::~string((string *)&output);
    goto switchD_00294bb2_caseD_7;
  case DIRECTORY:
    pcVar13 = status_00->Makefile;
    if (name._M_string_length != 0) {
      psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar13);
      cmsys::SystemTools::CollapseFullPath(&output,&name,psVar11);
      pcVar12 = cmMakefile::GetGlobalGenerator(status_00->Makefile);
      pcVar13 = cmGlobalGenerator::FindMakefile(pcVar12,&output);
      if (pcVar13 == (cmMakefile *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,&local_129);
        std::__cxx11::string::_M_assign((string *)&status_00->Error);
        std::__cxx11::string::~string((string *)&local_e0);
        break;
      }
      std::__cxx11::string::~string((string *)&output);
    }
    bVar4 = std::operator==(&propertyName,"DEFINITIONS");
    if (bVar4) {
      PVar7 = cmMakefile::GetPolicyStatus(pcVar13,CMP0059,false);
      if (PVar7 != OLD) {
        if (PVar7 != WARN) goto LAB_00294f80;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&output,(cmPolicies *)0x3b,id);
        cmMakefile::IssueMessage(pcVar13,AUTHOR_WARNING,&output);
        std::__cxx11::string::~string((string *)&output);
      }
      pcVar22 = status_00->Makefile;
      value = cmMakefile::GetDefineFlagsCMP0059(pcVar13);
LAB_00294e8d:
      (anonymous_namespace)::StoreResult<char_const*>(local_13c,pcVar22,name_00,value);
    }
    else {
LAB_00294f80:
      pcVar22 = status_00->Makefile;
      cVar14 = cmMakefile::GetProperty(pcVar13,&propertyName);
LAB_0029532d:
      anon_unknown.dwarf_89a4a5::StoreResult<cmValue>(local_13c,pcVar22,name_00,cVar14);
    }
    goto switchD_00294bb2_caseD_7;
  case GLOBAL:
    if (name._M_string_length == 0) {
      pcVar10 = cmMakefile::GetCMakeInstance(status_00->Makefile);
      pcVar22 = status_00->Makefile;
      cVar14 = cmState::GetGlobalProperty
                         ((pcVar10->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&propertyName);
      goto LAB_0029532d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"given name for GLOBAL scope.",(allocator<char> *)&local_e0);
    std::__cxx11::string::_M_assign((string *)&status_00->Error);
    break;
  case CACHE:
    if (name._M_string_length != 0) {
      pcVar8 = cmMakefile::GetState(status_00->Makefile);
      cVar14 = cmState::GetCacheEntryValue(pcVar8,&name);
      if (cVar14.Value == (string *)0x0) {
        cVar14.Value = (string *)0x0;
      }
      else {
        pcVar8 = cmMakefile::GetState(status_00->Makefile);
        cVar14 = cmState::GetCacheEntryProperty(pcVar8,&name,&propertyName);
      }
LAB_002952c9:
      pcVar22 = status_00->Makefile;
      goto LAB_0029532d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"not given name for CACHE scope.",(allocator<char> *)&local_e0);
    std::__cxx11::string::_M_assign((string *)&status_00->Error);
    break;
  case TEST:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for TEST scope.",(allocator<char> *)&local_e0);
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
    }
    else {
      this_01 = cmMakefile::GetTest(test_directory_makefile,&name);
      if (this_01 != (cmTest *)0x0) {
        pcVar22 = status_00->Makefile;
        cVar14 = cmTest::GetProperty(this_01,&propertyName);
        goto LAB_0029532d;
      }
      cmStrCat<char_const(&)[38],std::__cxx11::string_const&>
                (&output,(char (*) [38])"given TEST name that does not exist: ",&name);
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
    }
    break;
  case VARIABLE:
    if (name._M_string_length == 0) {
      pcVar22 = status_00->Makefile;
      cVar14 = cmMakefile::GetDefinition(pcVar22,&propertyName);
      goto LAB_0029532d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"given name for VARIABLE scope.",(allocator<char> *)&local_e0);
    std::__cxx11::string::_M_assign((string *)&status_00->Error);
    break;
  default:
    goto switchD_00294bb2_caseD_7;
  case INSTALL:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for INSTALL scope.",(allocator<char> *)&local_e0)
      ;
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
    }
    else {
      pcVar10 = cmMakefile::GetCMakeInstance(status_00->Makefile);
      this_02 = cmake::GetOrCreateInstalledFile(pcVar10,status_00->Makefile,&name);
      if (this_02 != (cmInstalledFile *)0x0) {
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        output.field_2._M_allocated_capacity =
             output.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar4 = cmInstalledFile::GetProperty(this_02,&propertyName,&output);
        value_00._M_p = output._M_dataplus._M_p;
        if (!bVar4) {
          value_00._M_p = (char *)0x0;
        }
        (anonymous_namespace)::StoreResult<char_const*>
                  (local_13c,status_00->Makefile,name_00,value_00._M_p);
        goto LAB_002952a3;
      }
      cmStrCat<char_const(&)[56],std::__cxx11::string_const&>
                (&output,(char (*) [56])"given INSTALL name that could not be found or created: ",
                 &name);
      std::__cxx11::string::_M_assign((string *)&status_00->Error);
    }
  }
  std::__cxx11::string::~string((string *)&output);
LAB_002951fe:
  bVar6 = false;
switchD_00294bb2_caseD_7:
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&source_file_directory_makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
LAB_0029520e:
  std::__cxx11::string::~string((string *)&test_directory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_target_directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_directories);
  std::__cxx11::string::~string((string *)&propertyName);
  std::__cxx11::string::~string((string *)&name);
  return bVar6;
}

Assistant:

bool cmGetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  OutType infoType = OutValue;
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  std::string name;
  std::string propertyName;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  std::string test_directory;
  bool test_directory_option_enabled = false;

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat(
      "given invalid scope ", args[1],
      ".  "
      "Valid scopes are "
      "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."));
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType,
    DoingSourceDirectory,
    DoingSourceTargetDirectory,
    DoingTestDirectory,
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      infoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      infoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      infoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      infoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      name = args[i];
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::TEST &&
               args[i] == "DIRECTORY") {
      doing = DoingTestDirectory;
      test_directory_option_enabled = true;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingTestDirectory) {
      test_directory = args[i];
      doing = DoingNone;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      propertyName = args[i];
    } else {
      status.SetError(cmStrCat("given invalid argument \"", args[i], "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool source_file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  cmMakefile* test_directory_makefile;
  bool test_scopes_handled =
    SetPropertyCommand::HandleAndValidateTestDirectoryScopes(
      status, test_directory_option_enabled, test_directory,
      test_directory_makefile);
  if (!(source_file_scopes_handled && test_scopes_handled)) {
    return false;
  }

  // Compute requested output.
  if (infoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetShortDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetFullDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutDefined) {
    // Lookup if the property is defined
    if (status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                               scope)) {
      status.GetMakefile().AddDefinition(variable, "1");
    } else {
      status.GetMakefile().AddDefinition(variable, "0");
    }
  } else {
    // Dispatch property getting.
    cmMakefile& directory_scope_mf = *(source_file_directory_makefiles[0]);
    bool source_file_paths_should_be_absolute =
      source_file_directory_option_enabled ||
      source_file_target_option_enabled;

    switch (scope) {
      case cmProperty::GLOBAL:
        return HandleGlobalMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::DIRECTORY:
        return HandleDirectoryMode(status, name, infoType, variable,
                                   propertyName);
      case cmProperty::TARGET:
        return HandleTargetMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::SOURCE_FILE:
        return HandleSourceMode(status, name, infoType, variable, propertyName,
                                directory_scope_mf,
                                source_file_paths_should_be_absolute);
      case cmProperty::TEST:
        return HandleTestMode(status, name, infoType, variable, propertyName,
                              *test_directory_makefile);
      case cmProperty::VARIABLE:
        return HandleVariableMode(status, name, infoType, variable,
                                  propertyName);
      case cmProperty::CACHE:
        return HandleCacheMode(status, name, infoType, variable, propertyName);
      case cmProperty::INSTALL:
        return HandleInstallMode(status, name, infoType, variable,
                                 propertyName);

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}